

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation_Management_Header.cpp
# Opt level: O1

KDataStream * __thiscall
KDIS::PDU::Simulation_Management_Header::Encode
          (KDataStream *__return_storage_ptr__,Simulation_Management_Header *this)

{
  KDataStream::KDataStream(__return_storage_ptr__,Big_Endian);
  Header7::Encode(&this->super_Header,__return_storage_ptr__);
  (*(this->m_OriginatingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase
    [5])(&this->m_OriginatingEntityID,__return_storage_ptr__);
  (*(this->m_ReceivingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_ReceivingEntityID,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

KDataStream Simulation_Management_Header::Encode() const
{
    KDataStream stream;

    Simulation_Management_Header::Encode( stream );

    return stream;
}